

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Memory::Copy(Memory *dst,u32 dst_offset,Memory *src,u32 src_offset,u32 size)

{
  pointer puVar1;
  pointer puVar2;
  ulong __n;
  Enum EVar3;
  
  __n = (ulong)size;
  puVar1 = (dst->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  EVar3 = Error;
  if (__n + dst_offset <=
      (ulong)((long)(dst->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    puVar2 = (src->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (__n + src_offset <=
        (ulong)((long)(src->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
      EVar3 = Ok;
      if (size != 0) {
        memmove(puVar1 + dst_offset,puVar2 + src_offset,__n);
        EVar3 = Ok;
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Memory::Copy(Memory& dst,
                    u32 dst_offset,
                    const Memory& src,
                    u32 src_offset,
                    u32 size) {
  if (dst.IsValidAccess(dst_offset, 0, size) &&
      src.IsValidAccess(src_offset, 0, size)) {
    auto src_begin = src.data_.begin() + src_offset;
    auto src_end = src_begin + size;
    auto dst_begin = dst.data_.begin() + dst_offset;
    auto dst_end = dst_begin + size;
    if (src.self() == dst.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}